

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

roaring64_bitmap_t * roaring64_bitmap_or(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  art_val_t *paVar1;
  bool bVar2;
  int iVar3;
  roaring64_bitmap_t *art;
  art_val_t *paVar4;
  container_t *pcVar5;
  art_val_t *val;
  art_iterator_t *paVar6;
  bool bVar7;
  art_iterator_t it2;
  art_iterator_t it1;
  art_iterator_t local_140;
  art_iterator_t local_b8;
  
  art = (roaring64_bitmap_t *)roaring_malloc(0x10);
  (art->art).root = (art_node_t *)0x0;
  art->flags = '\0';
  art_init_iterator(&local_b8,&r1->art,true);
  art_init_iterator(&local_140,&r2->art,true);
LAB_0010c175:
  while( true ) {
    bVar2 = local_b8.value == (art_val_t *)0x0;
    bVar7 = local_140.value == (art_val_t *)0x0;
    if (bVar2 && bVar7) {
      return art;
    }
    paVar6 = &local_140;
    if ((!bVar2) && (!bVar7)) break;
    if (bVar2) goto LAB_0010c20d;
    if (bVar7) {
LAB_0010c1c4:
      paVar1 = local_b8.value;
      paVar4 = (art_val_t *)roaring_malloc(0x10);
      paVar4[1].key[0] = paVar1[1].key[0];
      pcVar5 = get_copy_of_container(*(container_t **)(paVar1[1].key + 2),paVar4[1].key,false);
      *(container_t **)(paVar4[1].key + 2) = pcVar5;
      art_insert((art_t *)art,local_b8.key,paVar4);
      paVar6 = &local_b8;
      goto LAB_0010c2a4;
    }
  }
  iVar3 = art_compare_keys(local_b8.key,local_140.key);
  paVar4 = local_b8.value;
  paVar1 = local_140.value;
  if (iVar3 != 0) {
    if (bVar7 || iVar3 < 0) goto LAB_0010c1c4;
    goto LAB_0010c217;
  }
  val = (art_val_t *)roaring_malloc(0x10);
  pcVar5 = container_or(*(container_t **)(paVar4[1].key + 2),paVar4[1].key[0],
                        *(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],val[1].key);
  *(container_t **)(val[1].key + 2) = pcVar5;
  art_insert((art_t *)art,local_b8.key,val);
  art_iterator_next(&local_b8);
  goto LAB_0010c2a4;
LAB_0010c20d:
  if (!bVar7) {
LAB_0010c217:
    paVar1 = local_140.value;
    paVar4 = (art_val_t *)roaring_malloc(0x10);
    paVar4[1].key[0] = paVar1[1].key[0];
    pcVar5 = get_copy_of_container(*(container_t **)(paVar1[1].key + 2),paVar4[1].key,false);
    *(container_t **)(paVar4[1].key + 2) = pcVar5;
    art_insert((art_t *)art,local_140.key,paVar4);
LAB_0010c2a4:
    art_iterator_next(paVar6);
  }
  goto LAB_0010c175;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_or(const roaring64_bitmap_t *r1,
                                        const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> output it1, it1++
        // 2. !it1_present && it2_present  -> output it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> output it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                result_leaf->container = container_or(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);
                art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it2.value);
            art_insert(&result->art, it2.key, (art_val_t *)result_leaf);
            art_iterator_next(&it2);
        }
    }
    return result;
}